

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O0

bool __thiscall Husky::ServerFrame::BindToLocalHost(ServerFrame *this,SOCKET *sock,u_short nPort)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  uint16_t in_DX;
  int *in_RSI;
  long in_RDI;
  int retval;
  sockaddr_in addrSock;
  int nRet;
  char *local_f8;
  char *local_e0;
  char *local_c8;
  allocator local_b1;
  string local_b0 [32];
  int local_90;
  sockaddr local_8c;
  allocator local_79;
  string local_78 [32];
  undefined4 local_58 [5];
  allocator local_41;
  string local_40 [38];
  uint16_t local_1a;
  int *local_18;
  bool local_1;
  
  local_1a = in_DX;
  local_18 = in_RSI;
  iVar1 = socket(2,1,0);
  *local_18 = iVar1;
  if (*local_18 == -1) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
      ;
    }
    else {
      local_c8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
      local_c8 = local_c8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"error [%s]",&local_41);
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    Limonp::Logger::LoggingF(3,local_c8,0xae,(string *)local_40,pcVar2);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1 = false;
  }
  else {
    local_58[0] = 1;
    iVar1 = setsockopt(*(int *)(in_RDI + 0x38),1,2,local_58,4);
    if (iVar1 == -1) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_e0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
        ;
      }
      else {
        local_e0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                           ,0x2f);
        local_e0 = local_e0 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"error [%s]",&local_79);
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      Limonp::Logger::LoggingF(3,local_e0,0xb5,(string *)local_78,pcVar2);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    local_8c.sa_family = 2;
    local_8c.sa_data._0_2_ = htons(local_1a);
    local_8c.sa_data._2_4_ = htonl(0);
    local_90 = bind(*local_18,&local_8c,0x10);
    if (local_90 == -1) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
        ;
      }
      else {
        local_f8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                           ,0x2f);
        local_f8 = local_f8 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"error [%s]",&local_b1);
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      Limonp::Logger::LoggingF(3,local_f8,0xc0,(string *)local_b0,pcVar2);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      close(*local_18);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool BindToLocalHost(SOCKET &sock,u_short nPort)   
            {
                sock=socket(AF_INET,SOCK_STREAM,0);
                if(INVALID_SOCKET==sock)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                int nRet = 1;
                if(SOCKET_ERROR==setsockopt(m_lsnSock, SOL_SOCKET, SO_REUSEADDR, (char*)&nRet, sizeof(nRet)))
                {	
                    LogError("error [%s]", strerror(errno));
                }

                struct sockaddr_in addrSock;
                addrSock.sin_family=AF_INET;
                addrSock.sin_port=htons(nPort);
                addrSock.sin_addr.s_addr=htonl(INADDR_ANY);
                int retval;
                retval = ::bind(sock,(sockaddr*)&addrSock,sizeof(sockaddr));
                if(SOCKET_ERROR==retval)
                {
                    LogError("error [%s]", strerror(errno));
                    closesocket(sock);
                    return false;
                }

                return true;

            }